

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubsumptionDemodulationHelper.hpp
# Opt level: O0

TermList __thiscall Inferences::OverlayBinder::apply(OverlayBinder *this,Var var)

{
  bool bVar1;
  uint in_ESI;
  TermList *in_RDI;
  Var unaff_retaddr;
  OverlayBinder *in_stack_00000008;
  TermList result;
  undefined1 in_stack_ffffffffffffffc3;
  TermList in_stack_fffffffffffffff8;
  
  Kernel::TermList::TermList((TermList *)&stack0xfffffffffffffff8);
  bVar1 = tryGetBinding(in_stack_00000008,unaff_retaddr,
                        (TermList *)in_stack_fffffffffffffff8._content);
  if (!bVar1) {
    Kernel::TermList::TermList(in_RDI,in_ESI,(bool)in_stack_ffffffffffffffc3);
    return (TermList)0x773a14;
  }
  return (TermList)in_stack_fffffffffffffff8._content;
}

Assistant:

TermList apply(Var var) const
    {
      TermList result;
      if (tryGetBinding(var, result)) {
        return result;
      } else {
        // We should never access unbound variables
        // (NOTE: we should not return the variable itself here, as this creates a risk of mixing variables coming from different clauses)
        ASSERTION_VIOLATION;
      }
    }